

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_image_dds.cxx
# Opt level: O2

bool __thiscall xray_re::xr_image::save_dds(xr_image *this,xr_writer *w,irect *rect)

{
  int iVar1;
  int iVar2;
  rgba32 *prVar3;
  rgba32 *__src;
  ulong uVar4;
  uint uVar5;
  uint height;
  bool bVar7;
  InputOptions in_opts;
  OutputOptions out_opts;
  CompressionOptions comp_opts;
  Compressor local_68;
  rgba32 *local_60;
  ulong local_58;
  xr_image *local_50;
  xr_writer *local_48;
  dds_writer dds;
  ulong uVar6;
  
  if (rect == (irect *)0x0) {
    uVar5 = this->m_width;
    height = this->m_height;
    prVar3 = this->m_data;
  }
  else {
    iVar1 = (rect->field_0).field_1.x1;
    iVar2 = (rect->field_0).field_1.y1;
    uVar5 = ((rect->field_0).field_1.x2 - iVar1) + 1U & 0x7fffffff;
    uVar6 = (ulong)uVar5;
    height = ((rect->field_0).field_1.y2 - iVar2) + 1U & 0x7fffffff;
    uVar4 = (ulong)height;
    local_48 = w;
    prVar3 = (rgba32 *)operator_new__((ulong)(height * uVar5) << 2);
    uVar5 = this->m_width;
    __src = this->m_data + (iVar2 * uVar5 + iVar1);
    local_60 = prVar3;
    local_58 = uVar6;
    local_50 = this;
    while (bVar7 = uVar4 != 0, uVar4 = uVar4 - 1, bVar7) {
      memcpy(prVar3,__src,uVar6 * 4);
      prVar3 = prVar3 + uVar6;
      __src = __src + uVar5;
    }
    uVar5 = (uint)local_58;
    prVar3 = local_60;
    this = local_50;
    w = local_48;
  }
  nvtt::InputOptions::InputOptions(&in_opts);
  nvtt::InputOptions::setTextureLayout(&in_opts,TextureType_2D,uVar5,height,1);
  nvtt::InputOptions::setWrapMode(&in_opts,WrapMode_Clamp);
  nvtt::InputOptions::setMipmapData(&in_opts,prVar3,uVar5,height,1,0,0);
  if ((prVar3 != (rgba32 *)0x0) && (prVar3 != this->m_data)) {
    operator_delete__(prVar3);
  }
  nvtt::InputOptions::setNormalMap(&in_opts,false);
  nvtt::InputOptions::setConvertToNormalMap(&in_opts,false);
  nvtt::InputOptions::setGamma(&in_opts,2.2,2.2);
  nvtt::InputOptions::setNormalizeMipmaps(&in_opts,false);
  nvtt::CompressionOptions::CompressionOptions(&comp_opts);
  nvtt::CompressionOptions::setFormat(&comp_opts,Format_BC3);
  nvtt::CompressionOptions::setQuality(&comp_opts,Quality_Highest);
  nvtt::OutputOptions::OutputOptions(&out_opts);
  dds.super_OutputHandler._vptr_OutputHandler = (_func_int **)&PTR__OutputHandler_00238960;
  dds.w = w;
  nvtt::OutputOptions::setOutputHandler(&out_opts,&dds.super_OutputHandler);
  nvtt::OutputOptions::setErrorHandler(&out_opts,(ErrorHandler *)0x0);
  nvtt::Compressor::Compressor(&local_68);
  bVar7 = nvtt::Compressor::process(&local_68,&in_opts,&comp_opts,&out_opts);
  nvtt::Compressor::~Compressor(&local_68);
  nvtt::OutputOptions::~OutputOptions(&out_opts);
  nvtt::CompressionOptions::~CompressionOptions(&comp_opts);
  nvtt::InputOptions::~InputOptions(&in_opts);
  return bVar7;
}

Assistant:

bool xr_image::save_dds(xr_writer& w, const irect* rect) const
{
#if 1
	int width, height;
	rgba32* data;
	if (rect) {
		width = int((rect->x2 - rect->x1 + 1) & INT_MAX);
		height = int((rect->y2 - rect->y1 + 1) & INT_MAX);
		data = new rgba32[width * height];
		const rgba32* src_data = &m_data[rect->y1*m_width + rect->x1];
		for (int i = 0; i != height; ++i) {
			memcpy(&data[i*width], src_data, width*sizeof(rgba32));
			src_data += m_width;
		}
	} else {
		width = m_width;
		height = m_height;
		data = m_data;
	}
#else
	int width = int(m_width & INT_MAX);
	int height = int(m_height & INT_MAX);
	const rgba32* data = m_data;
#endif

	nvtt::InputOptions in_opts;
	in_opts.setTextureLayout(nvtt::TextureType_2D, width, height);
	in_opts.setWrapMode(nvtt::WrapMode_Clamp);
	in_opts.setMipmapData(data, width, height);
	if (data != m_data)
		delete[] data;
	in_opts.setNormalMap(false);
	in_opts.setConvertToNormalMap(false);
	in_opts.setGamma(2.2f, 2.2f);
	in_opts.setNormalizeMipmaps(false);

	nvtt::CompressionOptions comp_opts;
	comp_opts.setFormat(nvtt::Format_BC3);
	comp_opts.setQuality(nvtt::Quality_Highest);

	nvtt::OutputOptions out_opts;
	dds_writer dds(w);
	out_opts.setOutputHandler(&dds);
	out_opts.setErrorHandler(0);

	return nvtt::Compressor().process(in_opts, comp_opts, out_opts);
}